

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMocker<bool_(long,_(anonymous_namespace)::TestValue_*)>::
UntypedPerformDefaultAction
          (FunctionMocker<bool_(long,_(anonymous_namespace)::TestValue_*)> *this,void *untyped_args,
          string *call_description)

{
  ActionResultHolder<bool> *pAVar1;
  ArgumentTuple *args;
  string *call_description_local;
  void *untyped_args_local;
  FunctionMocker<bool_(long,_(anonymous_namespace)::TestValue_*)> *this_local;
  
  pAVar1 = ActionResultHolder<bool>::
           PerformDefaultAction<bool(long,(anonymous_namespace)::TestValue*)>
                     (this,(ArgumentTuple *)untyped_args,call_description);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformDefaultAction(
      void* untyped_args,  // must point to an ArgumentTuple
      const std::string& call_description) const override {
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformDefaultAction(this, std::move(*args),
                                              call_description);
  }